

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O2

void __thiscall
CodeGenGenericContext::KillLateUnreadRegVmRegisters
          (CodeGenGenericContext *this,uchar *instRegKillInfo)

{
  byte bVar1;
  long lVar2;
  
  bVar1 = *instRegKillInfo;
  if (bVar1 != 0) {
    for (lVar2 = 0; (bVar1 & 0xf) != (uint)lVar2; lVar2 = lVar2 + 1) {
      KillUnreadRegVmRegister(this,instRegKillInfo[lVar2 + (ulong)(bVar1 >> 4) + 1]);
    }
  }
  return;
}

Assistant:

void CodeGenGenericContext::KillLateUnreadRegVmRegisters(unsigned char *instRegKillInfo)
{
	if(unsigned regKillCounts = *instRegKillInfo)
	{
		instRegKillInfo++;

		unsigned preKillCount = (regKillCounts >> 4);
		unsigned postKillCount = (regKillCounts & 0xf);

		instRegKillInfo += preKillCount;

		for(unsigned k = 0; k < postKillCount; k++)
			KillUnreadRegVmRegister(*instRegKillInfo++);
	}
}